

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O2

void __thiscall duckdb::CreateIndexInfo::Serialize(CreateIndexInfo *this,Serializer *serializer)

{
  CreateInfo::Serialize(&this->super_CreateInfo,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,200,"name",&this->index_name);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xc9,"table",&this->table);
  Serializer::WriteProperty<duckdb::IndexConstraintType>
            (serializer,0xcb,"constraint_type",&this->constraint_type);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (serializer,0xcc,"parsed_expressions",&this->parsed_expressions);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0xcd,"scan_types",&this->scan_types);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xce,"names",&this->names);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0xcf,"column_ids",&this->column_ids);
  Serializer::
  WritePropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            (serializer,0xd0,"options",&this->options);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xd1,"index_type_name",&this->index_type);
  return;
}

Assistant:

void CreateIndexInfo::Serialize(Serializer &serializer) const {
	CreateInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "name", index_name);
	serializer.WritePropertyWithDefault<string>(201, "table", table);
	/* [Deleted] (DeprecatedIndexType) "index_type" */
	serializer.WriteProperty<IndexConstraintType>(203, "constraint_type", constraint_type);
	serializer.WritePropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(204, "parsed_expressions", parsed_expressions);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(205, "scan_types", scan_types);
	serializer.WritePropertyWithDefault<vector<string>>(206, "names", names);
	serializer.WritePropertyWithDefault<vector<column_t>>(207, "column_ids", column_ids);
	serializer.WritePropertyWithDefault<case_insensitive_map_t<Value>>(208, "options", options);
	serializer.WritePropertyWithDefault<string>(209, "index_type_name", index_type);
}